

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_DistributionMapping.cpp
# Opt level: O2

DistributionMapping __thiscall
amrex::DistributionMapping::makeKnapSack(DistributionMapping *this,MultiFab *weight,int nmax)

{
  int nprocs;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  DistributionMapping DVar1;
  Vector<long,_std::allocator<long>_> cost;
  Real eff;
  
  anon_unknown_22::gather_weights(&cost,weight);
  nprocs = *(int *)(DAT_006e0650 + -0x38);
  std::make_shared<amrex::DistributionMapping::Ref>();
  KnapSackProcessorMap
            (this,&cost.super_vector<long,_std::allocator<long>_>,nprocs,&eff,true,nmax,true);
  std::_Vector_base<long,_std::allocator<long>_>::~_Vector_base
            ((_Vector_base<long,_std::allocator<long>_> *)&cost);
  DVar1.m_ref.super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = extraout_RDX._M_pi;
  DVar1.m_ref.super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)this;
  return (DistributionMapping)
         DVar1.m_ref.super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>
  ;
}

Assistant:

DistributionMapping
DistributionMapping::makeKnapSack (const MultiFab& weight, int nmax)
{
    BL_PROFILE("makeKnapSack");
    Vector<Long> cost = gather_weights(weight);
    int nprocs = ParallelContext::NProcsSub();
    Real eff;
    DistributionMapping r;
    r.KnapSackProcessorMap(cost, nprocs, &eff, true, nmax);
    return r;
}